

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,int is_selected)

{
  nk_style_edit *string;
  nk_command_buffer *o;
  nk_style_edit *pnVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  uint clen;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar15;
  float fVar16;
  undefined4 in_XMM3_Db;
  nk_rect rect;
  nk_rect b;
  nk_rect rect_00;
  nk_rect b_00;
  nk_rune unicode;
  undefined8 local_108;
  undefined8 uStack_100;
  nk_color local_f0;
  uint local_ec;
  int local_e8;
  float local_e4;
  nk_style_edit *local_e0;
  float local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  nk_command_buffer *local_c0;
  nk_style_edit *local_b8;
  nk_user_font *local_b0;
  ulong local_a8;
  ulong local_a0;
  float local_98;
  nk_text txt;
  
  local_b0 = (nk_user_font *)CONCAT44(in_register_0000000c,byte_len);
  local_e4 = pos_y;
  local_98 = x_offset;
  if (local_b0 == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3c2e,
                  "void nk_edit_draw_text(struct nk_command_buffer *, const struct nk_style_edit *, float, float, float, const char *, int, float, const struct nk_user_font *, struct nk_color, struct nk_color, int)"
                 );
  }
  clen = (uint)text;
  uVar6 = (ulong)text & 0xffffffff;
  if (clen != 0 && style != (nk_style_edit *)0x0) {
    unicode = 0;
    txt.padding.x = 0.0;
    txt.padding.y = 0.0;
    local_f0 = SUB84(font,0);
    txt.background = local_f0;
    txt.text = background;
    iVar2 = nk_utf_decode((char *)style,&unicode,clen);
    if (iVar2 != 0) {
      local_98 = local_98 + pos_x;
      local_d8 = 0.0;
      fStack_d4 = 0.0;
      uStack_d0 = 0;
      uStack_cc = 0;
      uVar12 = 0;
      iVar3 = 0;
      local_ec = clen;
      local_e0 = style;
      local_c0 = out;
      local_b8 = style;
      do {
        local_108 = 0;
        uStack_100 = 0;
        local_e8 = iVar3;
        while( true ) {
          lVar4 = (long)(int)uVar12;
          lVar13 = lVar4 << 0x20;
          local_a8 = (ulong)(uint)((int)uVar6 - (int)uVar12);
          iVar9 = -1;
          lVar7 = 0;
          local_a0 = uVar12;
          while( true ) {
            pnVar1 = local_b8;
            o = local_c0;
            string = local_e0;
            iVar3 = local_e8;
            iVar10 = (int)((ulong)lVar13 >> 0x20);
            iVar8 = (int)local_b8;
            if (((long)(int)clen <= lVar7 + lVar4) || (iVar2 == 0)) {
              if ((float)local_108 <= 0.0) {
                return;
              }
              fVar14 = local_d8 + local_e4;
              if (local_e8 == 0) {
                pos_x = local_98;
              }
              if (foreground != (nk_color)0x0) {
                rect_00.y = fVar14;
                rect_00.x = pos_x;
                uStack_100 = CONCAT44(in_XMM3_Db,local_108._4_4_);
                rect_00.w = (float)local_108;
                rect_00.h = row_height;
                local_108 = CONCAT44(row_height,(float)local_108);
                local_d8 = pos_x;
                fStack_d4 = fVar14;
                uStack_d0 = in_XMM0_Dc;
                uStack_cc = in_XMM0_Dd;
                nk_fill_rect(local_c0,rect_00,0.0,local_f0);
                pos_x = local_d8;
                fVar14 = fStack_d4;
                row_height = local_108._4_4_;
              }
              b_00.y = fVar14;
              b_00.x = pos_x;
              b_00.h = row_height;
              b_00.w = (float)local_108;
              nk_widget_text(o,b_00,(char *)string,(iVar10 + iVar8) - (int)string,&txt,0x11,local_b0
                            );
              return;
            }
            if (unicode != 0xd) break;
            iVar2 = nk_utf_decode((char *)((long)&(style->normal).type + lVar7 + lVar4 + 1),&unicode
                                  ,(int)local_a8 + iVar9);
            lVar13 = lVar13 + 0x100000000;
            lVar7 = lVar7 + 1;
            iVar9 = iVar9 + -1;
          }
          iVar5 = (int)lVar7;
          if (unicode == 10) break;
          fVar14 = (*local_b0->width)(local_b0->userdata,local_b0->height,
                                      (char *)((long)&(local_b8->normal).type + (lVar13 >> 0x20)),
                                      iVar2);
          local_108 = CONCAT44(local_108._4_4_,(float)local_108 + fVar14);
          uVar11 = (int)local_a0 + iVar2 + iVar5;
          uVar12 = (ulong)uVar11;
          iVar2 = nk_utf_decode((char *)((long)&(pnVar1->normal).type + (long)(int)uVar11),&unicode,
                                ((int)local_a8 - iVar2) - iVar5);
          uVar6 = (ulong)local_ec;
        }
        fVar16 = local_d8 + local_e4;
        fVar14 = pos_x;
        if (local_e8 == 0) {
          fVar14 = local_98;
        }
        fVar15 = row_height;
        if (foreground != (nk_color)0x0) {
          uStack_100 = CONCAT44(in_XMM3_Db,local_108._4_4_);
          rect.y = fVar16;
          rect.x = fVar14;
          rect.h = row_height;
          rect.w = (float)local_108;
          local_108 = CONCAT44(row_height,(float)local_108);
          nk_fill_rect(local_c0,rect,0.0,local_f0);
          fVar15 = local_108._4_4_;
        }
        b.y = fVar16;
        b.x = fVar14;
        b.h = fVar15;
        b.w = (float)local_108;
        nk_widget_text(o,b,(char *)local_e0,(iVar10 + iVar8) - (int)local_e0,&txt,0x12,local_b0);
        uVar11 = (int)local_a0 + iVar5 + 1;
        uVar12 = (ulong)uVar11;
        iVar3 = iVar3 + 1;
        local_e0 = (nk_style_edit *)((long)&(pnVar1->normal).type + (long)(int)uVar11);
        local_d8 = local_d8 + row_height;
        iVar2 = nk_utf_decode((char *)local_e0,&unicode,(int)local_a8 + iVar9);
        uVar6 = (ulong)local_ec;
      } while( true );
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_edit_draw_text(struct nk_command_buffer *out,
    const struct nk_style_edit *style, float pos_x, float pos_y,
    float x_offset, const char *text, int byte_len, float row_height,
    const struct nk_user_font *font, struct nk_color background,
    struct nk_color foreground, int is_selected)
{
    NK_ASSERT(out);
    NK_ASSERT(font);
    NK_ASSERT(style);
    if (!text || !byte_len || !out || !style) return;

    {int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    float line_width = 0;
    float glyph_width;
    const char *line = text;
    float line_offset = 0;
    int line_count = 0;

    struct nk_text txt;
    txt.padding = nk_vec2(0,0);
    txt.background = background;
    txt.text = foreground;

    glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
    if (!glyph_len) return;
    while ((text_len < byte_len) && glyph_len)
    {
        if (unicode == '\n') {
            /* new line separator so draw previous line */
            struct nk_rect label;
            label.y = pos_y + line_offset;
            label.h = row_height;
            label.w = line_width;
            label.x = pos_x;
            if (!line_count)
                label.x += x_offset;

            if (is_selected) /* selection needs to draw different background color */
                nk_fill_rect(out, label, 0, background);
            nk_widget_text(out, label, line, (int)((text + text_len) - line),
                &txt, NK_TEXT_CENTERED, font);

            text_len++;
            line_count++;
            line_width = 0;
            line = text + text_len;
            line_offset += row_height;
            glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
            continue;
        }
        if (unicode == '\r') {
            text_len++;
            glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
            continue;
        }
        glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
        line_width += (float)glyph_width;
        text_len += glyph_len;
        glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
        continue;
    }
    if (line_width > 0) {
        /* draw last line */
        struct nk_rect label;
        label.y = pos_y + line_offset;
        label.h = row_height;
        label.w = line_width;
        label.x = pos_x;
        if (!line_count)
            label.x += x_offset;

        if (is_selected)
            nk_fill_rect(out, label, 0, background);
        nk_widget_text(out, label, line, (int)((text + text_len) - line),
            &txt, NK_TEXT_LEFT, font);
    }}
}